

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::eval::Try_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::
handle_exception(Try_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *this
                ,Dispatch_State *t_ss,Boxed_Value *t_except)

{
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *t_node;
  Type_Conversions *pTVar1;
  Type_Conversions *pTVar2;
  long lVar3;
  undefined8 *puVar4;
  pointer pBVar5;
  pair<bool,_bool> pVar6;
  eval_error *this_00;
  __shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *in_RCX;
  Dispatch_State *t_ss_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  ulong uVar8;
  Boxed_Value BVar9;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>
  __l;
  allocator_type local_139;
  element_type *local_138;
  Scope_Push_Pop catch_scope;
  ulong local_110;
  undefined1 local_f0 [56];
  __shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> local_b8;
  Function_Params local_a8;
  undefined1 local_98 [16];
  string name;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  local_68;
  Param_Types local_50;
  
  local_138 = (element_type *)this;
  Boxed_Value::Object_Data::get();
  pTVar1 = t_ss[2].m_conversions.m_conversions._M_data;
  pTVar2 = (Type_Conversions *)t_ss[2].m_conversions.m_saves._M_data;
  local_110 = (long)pTVar2 - (long)pTVar1 >> 3;
  _Var7._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)&pTVar2[-1].m_conversion_saves.obj.saves.
                         super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                         ._M_impl.super__Vector_impl_data + 0x10);
  if (*(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(_Var7._M_pi)->_M_use_count)->_M_pi
      == 0x1d) {
    if (pTVar2 == pTVar1) {
      __assert_fail("end_point > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/include/chaiscript/language/chaiscript_eval.hpp"
                    ,0x4ee,
                    "Boxed_Value chaiscript::eval::Try_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>::handle_exception(const chaiscript::detail::Dispatch_State &, const Boxed_Value &) const [T = chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>]"
                   );
    }
    local_110 = local_110 - 1;
  }
  uVar8 = 1;
  do {
    if (local_110 <= uVar8) {
LAB_003b0882:
      BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var7._M_pi;
      BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = local_138;
      return (Boxed_Value)
             BVar9.m_data.
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
    }
    catch_scope.m_ds = (Dispatch_State *)t_except;
    chaiscript::detail::Dispatch_Engine::new_scope
              ((Stack_Holder *)
               (t_except->m_data).
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    lVar3 = *(long *)(&(t_ss[2].m_conversions.m_conversions._M_data)->field_0x0 + uVar8 * 8);
    puVar4 = *(undefined8 **)(lVar3 + 0x50);
    t_ss_00 = (Dispatch_State *)(*(long *)(lVar3 + 0x58) - (long)puVar4 >> 3);
    t_node = (AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
             ((long)&t_ss_00[-1].m_conversions.m_saves._M_data + 6);
    if ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)0x1 <
        t_node) {
      if (t_ss_00 != (Dispatch_State *)0x1) {
        pBVar5 = t_ss[2].m_conversions.m_saves._M_data[-1].saves.
                 super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (*(int *)&(pBVar5->m_data).
                     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi == 0x1d) {
          AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
                    ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
                      *)local_98,
                     (Dispatch_State *)
                     ((pBVar5[5].m_data.
                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_type_info).m_type_info);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
        }
        this_00 = (eval_error *)__cxa_allocate_exception(0x90);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_f0,"Internal error: catch block size unrecognized",
                   (allocator<char> *)&name);
        exception::eval_error::eval_error(this_00,(string *)local_f0);
        __cxa_throw(this_00,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
      }
      AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
                ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
                 local_f0,(Dispatch_State *)*puVar4);
      std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)
                 local_138,
                 (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)local_f0
                );
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f0 + 8));
LAB_003b0878:
      detail::Scope_Push_Pop::~Scope_Push_Pop(&catch_scope);
      _Var7._M_pi = extraout_RDX_00;
      goto LAB_003b0882;
    }
    Arg_List_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>::
    get_arg_name_abi_cxx11_
              (&name,(Arg_List_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
                      *)*puVar4,t_node);
    Arg_List_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>::
    get_arg_type_abi_cxx11_
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>
                *)local_f0,
               (Arg_List_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>> *)
               **(undefined8 **)(lVar3 + 0x50),
               (AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
               t_except,t_ss_00);
    __l._M_len = 1;
    __l._M_array = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>
                    *)local_f0;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
    ::vector(&local_68,__l,&local_139);
    dispatch::Param_Types::Param_Types(&local_50,&local_68);
    local_a8.m_end = (Boxed_Value *)(in_RCX + 1);
    pVar6 = dispatch::Param_Types::match
                      (&local_50,&local_a8,(Type_Conversions_State *)(t_except + 1));
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
    ::~vector(&local_50.m_types);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
    ::~vector(&local_68);
    std::__cxx11::string::~string((string *)local_f0);
    if (((ushort)pVar6 & 1) != 0) {
      std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_b8,in_RCX);
      chaiscript::detail::Dispatch_State::add_object
                ((Dispatch_State *)t_except,&name,(Boxed_Value *)&local_b8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
      if (*(long *)(lVar3 + 0x58) - *(long *)(lVar3 + 0x50) == 0x10) {
        AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
                  ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *
                   )local_f0,*(Dispatch_State **)(*(long *)(lVar3 + 0x50) + 8));
        std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)
                   local_138,
                   (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)
                   local_f0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f0 + 8));
        std::__cxx11::string::~string((string *)&name);
        goto LAB_003b0878;
      }
    }
    std::__cxx11::string::~string((string *)&name);
    detail::Scope_Push_Pop::~Scope_Push_Pop(&catch_scope);
    uVar8 = uVar8 + 1;
    _Var7._M_pi = extraout_RDX;
  } while( true );
}

Assistant:

Boxed_Value handle_exception(const chaiscript::detail::Dispatch_State &t_ss, const Boxed_Value &t_except) const {
        Boxed_Value retval;

        size_t end_point = this->children.size();
        if (this->children.back()->identifier == AST_Node_Type::Finally) {
          assert(end_point > 0);
          end_point = this->children.size() - 1;
        }
        for (size_t i = 1; i < end_point; ++i) {
          chaiscript::eval::detail::Scope_Push_Pop catch_scope(t_ss);
          auto &catch_block = *this->children[i];

          if (catch_block.children.size() == 1) {
            // No variable capture
            retval = catch_block.children[0]->eval(t_ss);
            break;
          } else if (catch_block.children.size() == 2 || catch_block.children.size() == 3) {
            const auto name = Arg_List_AST_Node<T>::get_arg_name(*catch_block.children[0]);

            if (dispatch::Param_Types(
                    std::vector<std::pair<std::string, Type_Info>>{Arg_List_AST_Node<T>::get_arg_type(*catch_block.children[0], t_ss)})
                    .match(Function_Params{t_except}, t_ss.conversions())
                    .first) {
              t_ss.add_object(name, t_except);

              if (catch_block.children.size() == 2) {
                // Variable capture
                retval = catch_block.children[1]->eval(t_ss);
                break;
              }
            }
          } else {
            if (this->children.back()->identifier == AST_Node_Type::Finally) {
              this->children.back()->children[0]->eval(t_ss);
            }
            throw exception::eval_error("Internal error: catch block size unrecognized");
          }
        }

        return retval;
      }